

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O1

char * __thiscall
GeneratedSaxParser::ParserTemplateBase::getNameByStringHash
          (ParserTemplateBase *this,StringHash *hash)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  uVar1 = *hash;
  if (uVar1 != 0) {
    p_Var4 = &(this->mHashNameMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->mHashNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar1]) {
      if (*(ulong *)(p_Var3 + 1) >= uVar1) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, uVar1 < *(ulong *)(p_Var2 + 1)))
    {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      return (char *)p_Var3[1]._M_parent;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ParserTemplateBase::getNameByStringHash( const StringHash& hash ) const
	{
		if ( hash == 0 )
			return 0;
		ElementNameMap::const_iterator it = mHashNameMap.find(hash);
		if ( it == mHashNameMap.end() )
			return 0;
		else
			return it->second;
	}